

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::ld_mnn_a(GB *this)

{
  u16 uVar1;
  long lVar2;
  u8 uVar3;
  
  lVar2 = (this->s).op_tick;
  if (lVar2 == 0x1e) {
    Write(this,(this->s).field_6.wz,(this->s).field_2.field_0.a);
    (this->s).op_tick = -2;
  }
  else if (lVar2 == 0x16) {
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    uVar3 = Read(this,uVar1);
    (this->s).field_6.field_0.w = uVar3;
  }
  else if (lVar2 == 0xe) {
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    uVar3 = Read(this,uVar1);
    (this->s).field_6.field_0.z = uVar3;
  }
  return;
}

Assistant:

void GB::ld_mnn_a() {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); break;
    case 30: Write(s.wz, s.a); op_done(); break;
  }
}